

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int aes_cbc_encrypt(aes_context *ctx,uint8_t *iv,uint8_t *input,size_t length,uint8_t *output)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  
  if ((length & 0xf) == 0) {
    iVar3 = 0;
    for (; length != 0; length = length - 0x10) {
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        output[lVar2] = iv[lVar2] ^ input[lVar2];
      }
      aes_encrypt(ctx,output,output);
      uVar1 = *(undefined8 *)(output + 8);
      *(undefined8 *)iv = *(undefined8 *)output;
      *(undefined8 *)(iv + 8) = uVar1;
      input = input + 0x10;
      output = output + 0x10;
    }
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int aes_cbc_encrypt(const aes_context* ctx, uint8_t iv[16], const uint8_t* input, size_t length, uint8_t* output) {
    int i;

    if (length % 16)
        return -1;
    while (length > 0) {
        for (i = 0; i < 16; i++)
            output[i] = (unsigned char)(input[i] ^ iv[i]);

        aes_ecb_encrypt(ctx, output, output);
        memcpy(iv, output, 16);

        input += 16;
        output += 16;
        length -= 16;
    }
    return 0;
}